

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O1

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::denoise
          (NonIterativeFeaturePreservingMeshFiltering *this)

{
  pointer *ppdVar1;
  undefined1 *__src;
  pointer pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ParameterSet *pPVar8;
  DataManager *pDVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  undefined1 auVar13 [8];
  value_handle vVar14;
  bool bVar15;
  PropertyT<OpenMesh::VectorT<double,_3>_> *pPVar16;
  reference pvVar17;
  long lVar18;
  undefined8 uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  VertexIter VVar30;
  undefined1 local_380 [8];
  TriMesh mesh;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  mollified_normals;
  double sigma_g_mean_edge_length_ratio;
  double sigma_f_mean_edge_length_ratio;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  undefined1 auStack_f8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  undefined1 local_d8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> new_point;
  undefined1 auStack_b8 [8];
  vector<double,_std::allocator<double>_> face_area;
  undefined1 local_98 [8];
  VertexIter v_it_1;
  undefined1 auStack_48 [8];
  VertexIter v_it;
  
  DataManager::getNoisyMesh((TriMesh *)local_380,(this->super_MeshDenoisingBase).data_manager_);
  if (mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _168_8_ !=
      mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _160_8_) {
    pPVar8 = (this->super_MeshDenoisingBase).parameter_set_;
    ppdVar1 = &face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    auStack_b8 = (undefined1  [8])ppdVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_b8,"sigma_f/mean_edge_length","");
    bVar15 = ParameterSet::getValue(pPVar8,(string *)auStack_b8,&sigma_g_mean_edge_length_ratio);
    if (auStack_b8 != (undefined1  [8])ppdVar1) {
      operator_delete((void *)auStack_b8);
    }
    if (bVar15) {
      pPVar8 = (this->super_MeshDenoisingBase).parameter_set_;
      auStack_b8 = (undefined1  [8])ppdVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_b8,"sigma_g/mean_edge_length","");
      bVar15 = ParameterSet::getValue
                         (pPVar8,(string *)auStack_b8,
                          (double *)
                          &mollified_normals.
                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (auStack_b8 != (undefined1  [8])ppdVar1) {
        operator_delete((void *)auStack_b8);
      }
      if (bVar15) {
        dVar10 = MeshDenoisingBase::getAverageEdgeLength
                           (&this->super_MeshDenoisingBase,(TriMesh *)local_380);
        auStack_b8 = (undefined1  [8])0x0;
        face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getFaceArea
                  (&this->super_MeshDenoisingBase,(TriMesh *)local_380,
                   (vector<double,_std::allocator<double>_> *)auStack_b8);
        auStack_f8 = (undefined1  [8])0x0;
        face_centroid.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        face_centroid.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getFaceCentroid
                  (&this->super_MeshDenoisingBase,(TriMesh *)local_380,
                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)auStack_f8);
        new_point.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(sigma_g_mean_edge_length_ratio * dVar10);
        mesh.super_Mesh.
        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
        refcount_fcolors_ = 0;
        mesh.super_Mesh.
        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
        refcount_ftextureIndex_ = 0;
        mollified_normals.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        mollified_normals.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        mollifiedNormals(this,(TriMesh *)local_380,
                         (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)auStack_f8,(vector<double,_std::allocator<double>_> *)auStack_b8,
                         (double)new_point.
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&mesh.super_Mesh.
                             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                             .
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             .refcount_fcolors_);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *)local_d8,
               (long)(mesh.super_Mesh.
                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                      .
                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      ._168_8_ -
                     mesh.super_Mesh.
                     super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                     .
                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     ._160_8_) >> 2,(allocator_type *)auStack_48);
        _auStack_48 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_380);
        while( true ) {
          VVar30 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_380);
          vVar14.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
          if (v_it.mesh_._0_4_ == (BaseHandle)VVar30.hnd_.super_BaseHandle.idx_ &&
              auStack_48 == (undefined1  [8])VVar30.mesh_) break;
          pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                              ((PropertyContainer *)&mesh,
                               (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                               mesh.super_Mesh.
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               ._412_4_);
          pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                              (pPVar16,(int)vVar14.super_BaseHandle.idx_);
          (((pointer)((long)local_d8 + (long)(int)v_it.mesh_._0_4_ * 0x18))->
          super_VectorDataT<double,_3>).values_[2] =
               (pvVar17->super_VectorDataT<double,_3>).values_[2];
          dVar3 = (pvVar17->super_VectorDataT<double,_3>).values_[1];
          (((pointer)((long)local_d8 + (long)(int)v_it.mesh_._0_4_ * 0x18))->
          super_VectorDataT<double,_3>).values_[0] =
               (pvVar17->super_VectorDataT<double,_3>).values_[0];
          (((pointer)((long)local_d8 + (long)(int)v_it.mesh_._0_4_ * 0x18))->
          super_VectorDataT<double,_3>).values_[1] = dVar3;
          v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)v_it.mesh_._0_4_ + 1);
          if (v_it.mesh_._4_4_ != 0) {
            OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)auStack_48);
          }
        }
        _local_98 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_380);
        local_110 = (double)new_point.
                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage *
                    (double)new_point.
                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
        while( true ) {
          VVar30 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_380);
          vVar14.super_BaseHandle.idx_ = v_it_1.mesh_._0_4_;
          if (v_it_1.mesh_._0_4_ == (BaseHandle)VVar30.hnd_.super_BaseHandle.idx_ &&
              local_98 == (undefined1  [8])VVar30.mesh_) break;
          pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                              ((PropertyContainer *)&mesh,
                               (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                               mesh.super_Mesh.
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               ._412_4_);
          pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                              (pPVar16,(int)vVar14.super_BaseHandle.idx_);
          dVar3 = (pvVar17->super_VectorDataT<double,_3>).values_[0];
          v_it_1._8_8_ = (pvVar17->super_VectorDataT<double,_3>).values_[1];
          dVar4 = (pvVar17->super_VectorDataT<double,_3>).values_[2];
          _auStack_48 = (VertexIter)ZEXT816(0);
          v_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
          v_it.skip_bits_ = 0;
          getVertexFaceNeighbor
                    (this,(TriMesh *)local_380,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)auStack_f8,(VertexHandle)v_it_1.mesh_._0_4_,
                     (double)new_point.
                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                     auStack_48);
          if ((int)((ulong)((long)v_it.mesh_ - (long)auStack_48) >> 2) < 1) {
            dVar26 = 0.0;
            dVar24 = 0.0;
            dVar23 = 0.0;
            dVar25 = 0.0;
          }
          else {
            dVar25 = 0.0;
            lVar22 = 0;
            dVar23 = 0.0;
            dVar24 = 0.0;
            dVar26 = 0.0;
            do {
              lVar18 = (long)*(int *)((long)&(((mesh_ptr)auStack_48)->super_ArrayKernel).
                                             super_BaseKernel._vptr_BaseKernel + lVar22 * 4);
              lVar12 = lVar18 * 0x18;
              dVar27 = (((pointer)((long)auStack_f8 + lVar18 * 0x18))->super_VectorDataT<double,_3>)
                       .values_[0];
              dVar28 = (((pointer)((long)auStack_f8 + lVar18 * 0x18))->super_VectorDataT<double,_3>)
                       .values_[1];
              dVar29 = (((pointer)((long)auStack_f8 + lVar18 * 0x18))->super_VectorDataT<double,_3>)
                       .values_[2];
              dVar5 = *(double *)
                       (mesh.super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        ._544_8_ + lVar12);
              dVar6 = *(double *)
                       (mesh.super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        ._544_8_ + 8 + lVar12);
              dVar7 = *(double *)
                       (mesh.super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        ._544_8_ + 0x10 + lVar12);
              dVar11 = dVar29 - dVar4;
              dVar11 = dVar11 * dVar11 +
                       (dVar27 - dVar3) * (dVar27 - dVar3) +
                       (dVar28 - (double)v_it_1._8_8_) * (dVar28 - (double)v_it_1._8_8_);
              sigma_f_mean_edge_length_ratio = dVar25;
              local_128 = dVar23;
              local_120 = dVar24;
              local_118 = dVar26;
              if (dVar11 < 0.0) {
                local_108 = dVar28;
                local_100 = dVar27;
                dVar11 = sqrt(dVar11);
                dVar27 = local_100;
                dVar28 = local_108;
              }
              else {
                dVar11 = SQRT(dVar11);
              }
              dVar26 = (dVar4 - dVar29) * dVar7 +
                       ((double)v_it_1._8_8_ - dVar28) * dVar6 + (dVar3 - dVar27) * dVar5 + 0.0;
              dVar27 = dVar3 - dVar5 * dVar26;
              dVar28 = (double)v_it_1._8_8_ - dVar6 * dVar26;
              dVar29 = dVar4 - dVar26 * dVar7;
              dVar26 = exp((dVar11 * -0.5 * dVar11) / local_110);
              dVar23 = dVar27 - dVar3;
              dVar24 = dVar28 - (double)v_it_1._8_8_;
              dVar25 = dVar29 - dVar4;
              dVar25 = dVar25 * dVar25 + dVar23 * dVar23 + dVar24 * dVar24;
              if (dVar25 < 0.0) {
                dVar25 = sqrt(dVar25);
              }
              else {
                dVar25 = SQRT(dVar25);
              }
              dVar6 = exp((dVar25 * -0.5 * dVar25) /
                          (dVar10 * (double)mollified_normals.
                                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage *
                          dVar10 * (double)mollified_normals.
                                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage));
              dVar5 = *(double *)
                       ((long)auStack_b8 +
                       (long)*(int *)((long)&(((ArrayKernel *)auStack_48)->super_BaseKernel).
                                             _vptr_BaseKernel + lVar22 * 4) * 8);
              dVar24 = local_120 + dVar27 * dVar5 * dVar26 * dVar6;
              dVar23 = local_128 + dVar28 * dVar5 * dVar26 * dVar6;
              dVar25 = sigma_f_mean_edge_length_ratio + dVar29 * dVar5 * dVar26 * dVar6;
              dVar26 = local_118 + dVar26 * dVar5 * dVar6;
              lVar22 = lVar22 + 1;
            } while (lVar22 < (int)((ulong)((long)v_it.mesh_ - (long)auStack_48) >> 2));
          }
          uVar21 = (ulong)(int)v_it_1.mesh_._0_4_;
          uVar20 = ((long)new_point.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)local_d8 >> 3) *
                   -0x5555555555555555;
          if (uVar20 < uVar21 || uVar20 - uVar21 == 0) {
            uVar19 = std::__throw_out_of_range_fmt
                               (
                               "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               );
            if (local_d8 != (undefined1  [8])0x0) {
              operator_delete((void *)local_d8);
            }
            if (mesh.super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ._544_8_ != 0) {
              operator_delete((void *)mesh.super_Mesh.
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                      ._544_8_);
            }
            if (auStack_f8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_f8);
            }
            if (auStack_b8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_b8);
            }
            OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_380);
            _Unwind_Resume(uVar19);
          }
          (((pointer)((long)local_d8 + uVar21 * 0x18))->super_VectorDataT<double,_3>).values_[0] =
               dVar24 / dVar26;
          (((pointer)((long)local_d8 + uVar21 * 0x18))->super_VectorDataT<double,_3>).values_[1] =
               dVar23 / dVar26;
          (((pointer)((long)local_d8 + uVar21 * 0x18))->super_VectorDataT<double,_3>).values_[2] =
               dVar25 / dVar26;
          if (auStack_48 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_48);
          }
          v_it_1.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)v_it_1.mesh_._0_4_ + 1);
          if (v_it_1.mesh_._4_4_ != 0) {
            OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)local_98);
          }
        }
        _auStack_48 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_380);
        while( true ) {
          VVar30 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_380);
          auVar13 = local_d8;
          vVar14.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
          if (v_it.mesh_._0_4_ == (BaseHandle)VVar30.hnd_.super_BaseHandle.idx_ &&
              auStack_48 == (undefined1  [8])VVar30.mesh_) break;
          lVar22 = (long)(int)v_it.mesh_._0_4_;
          pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                              ((PropertyContainer *)&mesh,
                               (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                               mesh.super_Mesh.
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               ._412_4_);
          pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                              (pPVar16,(int)vVar14.super_BaseHandle.idx_);
          pVVar2 = (pointer)((long)auVar13 + lVar22 * 0x18);
          dVar10 = (pVVar2->super_VectorDataT<double,_3>).values_[1];
          (pvVar17->super_VectorDataT<double,_3>).values_[0] =
               (pVVar2->super_VectorDataT<double,_3>).values_[0];
          (pvVar17->super_VectorDataT<double,_3>).values_[1] = dVar10;
          (pvVar17->super_VectorDataT<double,_3>).values_[2] =
               (((pointer)((long)auVar13 + lVar22 * 0x18))->super_VectorDataT<double,_3>).values_[2]
          ;
          v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)v_it.mesh_._0_4_ + 1);
          if (v_it.mesh_._4_4_ != 0) {
            OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)auStack_48);
          }
        }
        pDVar9 = (this->super_MeshDenoisingBase).data_manager_;
        OpenMesh::PolyConnectivity::operator=
                  ((PolyConnectivity *)&pDVar9->mesh_,(PolyConnectivity *)local_380);
        __src = &mesh.super_Mesh.
                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                 .
                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                 .field_0x19c;
        memcpy(&(pDVar9->mesh_).super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .points_,__src,0x84);
        pDVar9 = (this->super_MeshDenoisingBase).data_manager_;
        OpenMesh::PolyConnectivity::operator=
                  ((PolyConnectivity *)&pDVar9->denoised_mesh_,(PolyConnectivity *)local_380);
        memcpy(&(pDVar9->denoised_mesh_).super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .points_,__src,0x84);
        if (local_d8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_d8);
        }
        if (mesh.super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            ._544_8_ != 0) {
          operator_delete((void *)mesh.super_Mesh.
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                  ._544_8_);
        }
        if (auStack_f8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_f8);
        }
        if (auStack_b8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_b8);
        }
      }
    }
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_380);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // get parameter
    double sigma_g_mean_edge_length_ratio, sigma_f_mean_edge_length_ratio;
    if(!parameter_set_->getValue(string("sigma_f/mean_edge_length"), sigma_f_mean_edge_length_ratio))
        return;
    if(!parameter_set_->getValue(string("sigma_g/mean_edge_length"), sigma_g_mean_edge_length_ratio))
        return;

    // mesh denoise
    double mean_edge_length = getAverageEdgeLength(mesh);
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);
    std::vector<TriMesh::Point> face_centroid;
    getFaceCentroid(mesh, face_centroid);

    double sigma_f = sigma_f_mean_edge_length_ratio * mean_edge_length;
    double sigma_g = sigma_g_mean_edge_length_ratio * mean_edge_length;

    std::vector<TriMesh::Normal> mollified_normals;
    mollifiedNormals(mesh, face_centroid, face_area, sigma_f, mollified_normals);

    std::vector<TriMesh::Point> new_point(mesh.n_vertices());
    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
        new_point[v_it->idx()] = mesh.point(*v_it);

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        TriMesh::Point pt = mesh.point(*v_it);

        std::vector<TriMesh::FaceHandle> vertex_face_neighbor;
        getVertexFaceNeighbor(mesh, face_centroid, *v_it, sigma_f, vertex_face_neighbor);

        TriMesh::Point temp_point(0.0, 0.0, 0.0);
        double weight_sum = 0.0;

        for(int i = 0; i <(int)vertex_face_neighbor.size(); i++)
        {
            TriMesh::Point centroid = face_centroid[vertex_face_neighbor[i].idx()];
            TriMesh::Normal normal = mollified_normals[vertex_face_neighbor[i].idx()];
            TriMesh::Point projection_point = projectPoint(pt, centroid, normal);

            double distance_spatial = (centroid - pt).length();
            double weight_spatial = std::exp(- 0.5 * distance_spatial * distance_spatial /(sigma_f * sigma_f));

            double distance_influence = (projection_point - pt).length();
            double weight_influence = std::exp(- 0.5 * distance_influence * distance_influence /(sigma_g * sigma_g));

            double area = face_area[vertex_face_neighbor[i].idx()];

            temp_point += projection_point * area * weight_spatial * weight_influence;
            weight_sum += area * weight_spatial * weight_influence;
        }
        temp_point /= weight_sum;

        new_point.at((*v_it).idx()) = temp_point;
    }

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
        mesh.set_point(*v_it, new_point[(*v_it).idx()]);

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}